

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O2

SstStatusValue SstFFSPerformGets(SstStream Stream)

{
  SstFullMetadata p_Var1;
  void *pvVar2;
  FFSArrayRequest_conflict pFVar3;
  void **ppvVar4;
  size_t sVar5;
  size_t *SelectionCounts;
  int iVar6;
  SstStatusValue SVar7;
  ulong uVar8;
  void *pvVar9;
  void *pvVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  size_t sVar13;
  char *pcVar14;
  FFSVarRec_conflict pFVar15;
  _range_list *uncovered_list;
  size_t *PartialOffsets;
  size_t *psVar16;
  size_t *SelectionOffsets;
  long lVar17;
  long lVar18;
  size_t BlockElemCount;
  FFSArrayRequest **ppFVar19;
  long *plVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  FFSArrayRequest **ppFVar24;
  int j;
  size_t *PartialCounts;
  int WriterRank;
  int iVar25;
  long lVar26;
  undefined8 *puVar27;
  size_t *__ptr;
  int WriterRank_1;
  int i;
  ulong uVar28;
  size_t *__ptr_00;
  undefined1 auVar29 [16];
  size_t *local_170;
  void *local_138 [33];
  
  p_Var1 = Stream->CurrentMetadata;
  pvVar2 = Stream->ReaderMarshalData;
  ppFVar24 = (FFSArrayRequest **)((long)pvVar2 + 0x18);
  ppFVar19 = ppFVar24;
  while (pFVar3 = *ppFVar19, pFVar3 != (FFSArrayRequest_conflict)0x0) {
    uVar28 = 0;
    uVar8 = (ulong)(uint)Stream->WriterCohortSize;
    if (Stream->WriterCohortSize < 1) {
      uVar8 = uVar28;
    }
    iVar22 = 0;
    for (; uVar8 * 0x18 - uVar28 != 0; uVar28 = uVar28 + 0x18) {
      lVar23 = *(long *)((long)pvVar2 + 0x40);
      if (*(int *)(lVar23 + uVar28) != 1) {
        iVar6 = NeedWriter(pFVar3,iVar22);
        if (iVar6 != 0) {
          *(undefined4 *)(lVar23 + uVar28) = 1;
        }
      }
      iVar22 = iVar22 + 1;
    }
    ppFVar19 = &pFVar3->Next;
  }
  lVar23 = 0;
  for (lVar26 = 0; uVar8 = (ulong)Stream->WriterCohortSize, lVar26 < (long)uVar8;
      lVar26 = lVar26 + 1) {
    if (*(int *)(*(long *)((long)pvVar2 + 0x40) + lVar23) == 1) {
      ppvVar4 = p_Var1->DP_TimestepInfo;
      if (ppvVar4 == (void **)0x0) {
        pvVar10 = (void *)0x0;
      }
      else {
        pvVar10 = ppvVar4[lVar26];
      }
      sVar13 = *(size_t *)(*(long *)(*(long *)((long)pvVar2 + 0x20) + lVar26 * 8) + 0x10);
      pvVar9 = realloc(*(void **)(*(long *)((long)pvVar2 + 0x40) + 8 + lVar23),sVar13);
      *(void **)(*(long *)((long)pvVar2 + 0x40) + 8 + lVar23) = pvVar9;
      memset(local_138,0,0x100);
      snprintf((char *)local_138,0x100,"Request to rank %d, bytes");
      if (_perfstubs_initialized == 1) {
        if (IssueReadRequests___var842 == 0) {
          IssueReadRequests___var842 = ps_create_counter_(local_138);
        }
        auVar29._8_4_ = (int)(sVar13 >> 0x20);
        auVar29._0_8_ = sVar13;
        auVar29._12_4_ = 0x45300000;
        ps_sample_counter_((auVar29._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar13) - 4503599627370496.0),
                           IssueReadRequests___var842);
      }
      pvVar10 = SstReadRemoteMemory(Stream,(int)lVar26,Stream->ReaderTimestep,0,sVar13,
                                    *(void **)(*(long *)((long)pvVar2 + 0x40) + 8 + lVar23),pvVar10)
      ;
      lVar17 = *(long *)((long)pvVar2 + 0x40);
      *(void **)(lVar17 + 0x10 + lVar23) = pvVar10;
      *(undefined4 *)(lVar17 + lVar23) = 2;
    }
    lVar23 = lVar23 + 0x18;
  }
  pvVar2 = Stream->ReaderMarshalData;
  uVar28 = 0;
  do {
    if ((long)(int)uVar8 <= (long)uVar28) {
      SVar7 = SstSuccess;
      CP_verbose(Stream,TraceVerbose,"All remote memory reads completed\n");
      if (Stream->ConfigParams->ReaderShortCircuitReads == 0) {
        SVar7 = SstSuccess;
        while( true ) {
          pFVar3 = *ppFVar24;
          if (pFVar3 == (FFSArrayRequest_conflict)0x0) break;
          if ((pFVar3->RequestType != Local) && (pFVar3->VarRec->DimCount == 1)) {
            uncovered_list = (_range_list *)malloc(0x18);
            uncovered_list->next = (_range_list *)0x0;
            sVar5 = *pFVar3->Start;
            uncovered_list->start = sVar5;
            uncovered_list->end = (sVar5 + *pFVar3->Count) - 1;
            for (lVar23 = 0; lVar23 < Stream->WriterCohortSize; lVar23 = lVar23 + 1) {
              sVar5 = *pFVar3->VarRec->PerWriterStart[lVar23];
              uncovered_list =
                   OneDCoverage(sVar5,(sVar5 + *pFVar3->VarRec->PerWriterCounts[lVar23]) - 1,
                                uncovered_list);
            }
            if (uncovered_list != (range_list)0x0) {
              printf("WARNING:   Reader Rank %d requested elements %zu - %zu,\n\tbut these elements were not written by any writer rank: \n"
                     ,(ulong)(uint)Stream->Rank,*pFVar3->Start,*pFVar3->Start + *pFVar3->Count + -1)
              ;
              for (; uncovered_list != (range_list)0x0; uncovered_list = uncovered_list->next) {
                printf("%zd - %zd",uncovered_list->start,uncovered_list->end);
                if (uncovered_list->next == (_range_list *)0x0) break;
                printf(", ");
              }
            }
          }
          for (lVar23 = 0; lVar23 < Stream->WriterCohortSize; lVar23 = lVar23 + 1) {
            iVar22 = NeedWriter(pFVar3,(int)lVar23);
            if (iVar22 != 0) {
              pFVar15 = pFVar3->VarRec;
              iVar22 = pFVar15->ElementSize;
              PartialCounts = pFVar15->PerWriterCounts[lVar23];
              SelectionOffsets = pFVar3->Start;
              SelectionCounts = pFVar3->Count;
              pcVar14 = (char *)pFVar15->PerWriterIncomingData[lVar23];
              iVar6 = (int)pFVar15->DimCount;
              if (pFVar3->RequestType == Local) {
                lVar26 = pFVar3->BlockID - pFVar15->PerWriterBlockStart[lVar23];
                sVar13 = (size_t)iVar6;
                uVar8 = 0;
                if (0 < iVar6) {
                  uVar8 = pFVar15->DimCount & 0xffffffff;
                }
                lVar21 = 0;
                psVar16 = PartialCounts;
                for (lVar17 = 0; lVar17 != lVar26; lVar17 = lVar17 + 1) {
                  lVar18 = 1;
                  for (uVar28 = 0; uVar8 != uVar28; uVar28 = uVar28 + 1) {
                    lVar18 = lVar18 * psVar16[uVar28];
                  }
                  lVar21 = lVar21 + lVar18 * iVar22;
                  psVar16 = psVar16 + sVar13;
                }
                PartialOffsets = (size_t *)calloc(sVar13,8);
                psVar16 = (size_t *)calloc(sVar13,8);
                if (SelectionOffsets == (size_t *)0x0) {
                  SelectionOffsets = (size_t *)calloc(sVar13,8);
                  local_170 = SelectionOffsets;
                }
                else {
                  local_170 = (size_t *)0x0;
                }
                PartialCounts = (size_t *)((long)PartialCounts + sVar13 * 8 * lVar26);
                while (iVar25 = (int)uVar8, uVar8 = (ulong)(iVar25 - 1), iVar25 != 0) {
                  psVar16[lVar23] = PartialCounts[lVar23];
                }
                pcVar14 = pcVar14 + lVar21;
                __ptr = PartialOffsets;
                __ptr_00 = psVar16;
              }
              else {
                psVar16 = pFVar15->GlobalDims;
                PartialOffsets = pFVar15->PerWriterStart[lVar23];
                __ptr_00 = (size_t *)0x0;
                __ptr = (size_t *)0x0;
                local_170 = (size_t *)0x0;
              }
              if (Stream->ConfigParams->IsRowMajor == 0) {
                ExtractSelectionFromPartialCM
                          (iVar22,(long)iVar6,psVar16,PartialOffsets,PartialCounts,SelectionOffsets,
                           SelectionCounts,pcVar14,(char *)pFVar3->Data);
              }
              else {
                ExtractSelectionFromPartialRM
                          (iVar22,(long)iVar6,psVar16,PartialOffsets,PartialCounts,SelectionOffsets,
                           SelectionCounts,pcVar14,(char *)pFVar3->Data);
              }
              free(local_170);
              free(__ptr_00);
              free(__ptr);
            }
          }
          ppFVar24 = &pFVar3->Next;
        }
      }
LAB_00119eec:
      pvVar2 = Stream->ReaderMarshalData;
      pvVar10 = *(void **)((long)pvVar2 + 0x18);
      while (pvVar10 != (void *)0x0) {
        pvVar9 = *(void **)((long)pvVar10 + 0x30);
        free(*(void **)((long)pvVar10 + 0x20));
        free(*(void **)((long)pvVar10 + 0x18));
        free(pvVar10);
        pvVar10 = pvVar9;
      }
      *(undefined8 *)((long)pvVar2 + 0x18) = 0;
      return SVar7;
    }
    lVar23 = *(long *)((long)pvVar2 + 0x40);
    lVar26 = uVar28 * 0x18;
    if (*(int *)(lVar23 + lVar26) == 2) {
      SVar7 = SstWaitForCompletion(Stream,*(void **)(lVar23 + lVar26 + 0x10));
      if (SVar7 != SstSuccess) {
        CP_verbose(Stream,CriticalVerbose,
                   "Wait for remote read completion failed, returning failure\n");
        CP_verbose(Stream,CriticalVerbose,
                   "Some memory read failed, not filling requests and returning failure\n");
        goto LAB_00119eec;
      }
      *(undefined4 *)(*(long *)((long)pvVar2 + 0x40) + lVar26) = 3;
      if (Stream->ConfigParams->ReaderShortCircuitReads == 0) {
        pvVar10 = Stream->ReaderMarshalData;
        puVar27 = (undefined8 *)(*(long *)((long)pvVar10 + 0x40) + lVar26 + 8);
        uVar11 = FFSTypeHandle_from_encode(Stream->ReaderFFSContext,*puVar27);
        iVar22 = FFShas_conversion(uVar11);
        if (iVar22 == 0) {
          uVar12 = FMContext_from_FFS(Stream->ReaderFFSContext);
          uVar12 = FMformat_from_ID(uVar12,*puVar27);
          uVar12 = format_list_of_FMFormat(uVar12);
          uVar12 = FMcopy_struct_list(uVar12);
          FMlocalize_structs(uVar12);
          establish_conversion(Stream->ReaderFFSContext,uVar11,uVar12);
          FMfree_struct_list(uVar12);
        }
        iVar22 = FFSdecode_in_place_possible(uVar11);
        if (iVar22 == 0) {
          sVar13 = FFS_est_decode_length
                             (Stream->ReaderFFSContext,*puVar27,
                              *(undefined8 *)
                               (*(long *)(*(long *)((long)pvVar10 + 0x20) + uVar28 * 8) + 0x10));
          pvVar9 = malloc(sVar13);
          local_138[0] = pvVar9;
          uVar12 = create_fixed_FFSBuffer(pvVar9,sVar13);
          FFSdecode_to_buffer(Stream->ReaderFFSContext,*puVar27,uVar12);
        }
        else {
          FFSdecode_in_place(Stream->ReaderFFSContext,*puVar27,local_138);
          pvVar9 = local_138[0];
        }
        pcVar14 = getenv("SstDumpData");
        if (pcVar14 != (char *)0x0) {
          printf("\nOn Rank %d, IncomingDatablock from writer %d is %p :\n",
                 (ulong)(uint)Stream->Rank,uVar28 & 0xffffffff,pvVar9);
          uVar12 = FMFormat_of_original(uVar11);
          FMdump_data(uVar12,local_138[0],0xfa000);
          pvVar9 = local_138[0];
        }
        *(void **)(*(long *)((long)pvVar10 + 0x30) + uVar28 * 8) = pvVar9;
        uVar11 = FMFormat_of_original(uVar11);
        lVar23 = format_list_of_FMFormat(uVar11);
        lVar23 = *(long *)(lVar23 + 8);
        *(long *)(*(long *)((long)pvVar10 + 0x38) + uVar28 * 8) = lVar23;
        for (plVar20 = (long *)(lVar23 + 0x18); plVar20[-3] != 0; plVar20 = plVar20 + 6) {
          pFVar15 = LookupVarByName(Stream,(char *)(*plVar20 + 4));
          if (pFVar15 != (FFSVarRec_conflict)0x0) {
            iVar22 = *(int *)((long)plVar20 + -4);
            pFVar15->PerWriterIncomingData[uVar28] =
                 *(void **)((long)local_138[0] + (long)iVar22 + 8);
            pFVar15->PerWriterIncomingSize[uVar28] = *(size_t *)((long)local_138[0] + (long)iVar22);
          }
        }
      }
    }
    uVar28 = uVar28 + 1;
    uVar8 = (ulong)(uint)Stream->WriterCohortSize;
  } while( true );
}

Assistant:

static void IssueReadRequests(SstStream Stream, FFSArrayRequest Reqs)
{
    struct FFSReaderMarshalBase *Info = Stream->ReaderMarshalData;
    SstFullMetadata Mdata = Stream->CurrentMetadata;

    while (Reqs)
    {
        int i;
        for (i = 0; i < Stream->WriterCohortSize; i++)
        {
            if ((Info->WriterInfo[i].Status != Needed) && (NeedWriter(Reqs, i)))
            {
                Info->WriterInfo[i].Status = Needed;
            }
        }
        Reqs = Reqs->Next;
    }

    for (int WriterRank = 0; WriterRank < Stream->WriterCohortSize; WriterRank++)
    {
        if (Info->WriterInfo[WriterRank].Status == Needed)
        {
            size_t DataSize = ((struct FFSMetadataInfoStruct *)Info->MetadataBaseAddrs[WriterRank])
                                  ->DataBlockSize;
            void *DP_TimestepInfo =
                Mdata->DP_TimestepInfo ? Mdata->DP_TimestepInfo[WriterRank] : NULL;
            Info->WriterInfo[WriterRank].RawBuffer =
                realloc(Info->WriterInfo[WriterRank].RawBuffer, DataSize);

            char tmpstr[256] = {0};
            snprintf(tmpstr, sizeof(tmpstr), "Request to rank %d, bytes", WriterRank);
            PERFSTUBS_SAMPLE_COUNTER(tmpstr, (double)DataSize);
            Info->WriterInfo[WriterRank].ReadHandle =
                SstReadRemoteMemory(Stream, WriterRank, Stream->ReaderTimestep, 0, DataSize,
                                    Info->WriterInfo[WriterRank].RawBuffer, DP_TimestepInfo);
            Info->WriterInfo[WriterRank].Status = Requested;
        }
    }
}